

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_5::bufferedTileWrite
               (OutputStreamMutex *streamData,Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,
               int pixelDataSize)

{
  iterator __position;
  bool bVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  undefined8 uVar4;
  pointer ppVar5;
  BufferedTile *pBVar6;
  mapped_type *ppBVar7;
  int in_ECX;
  int in_EDX;
  OutputStreamMutex *in_RSI;
  Data *in_RDI;
  int in_R8D;
  int in_R9D;
  TileCoord TVar8;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_00000008;
  iterator i;
  stringstream _iex_throw_s_1;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  int iVar9;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  undefined8 in_stack_fffffffffffffb90;
  Data *in_stack_fffffffffffffb98;
  Data *ofd_00;
  OutputStreamMutex *in_stack_fffffffffffffba0;
  OutputStreamMutex *streamData_00;
  undefined4 in_stack_fffffffffffffba8;
  int iVar10;
  undefined4 in_stack_fffffffffffffbac;
  int iVar11;
  undefined4 in_stack_fffffffffffffbb0;
  int iVar12;
  undefined4 in_stack_fffffffffffffbb4;
  int iVar13;
  key_type *in_stack_fffffffffffffbb8;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_fffffffffffffbc0;
  undefined8 local_3a0;
  __pthread_internal_list *local_398;
  _Self local_380;
  _Self local_378;
  undefined1 local_370 [16];
  stringstream local_360 [16];
  ostream local_350 [376];
  _Self local_1d8;
  _Self local_1d0;
  TileCoord local_1c4;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  OutputStreamMutex *local_10;
  Data *local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  puVar2 = TileOffsets::operator()
                     ((TileOffsets *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                      (int)((ulong)in_stack_fffffffffffffba0 >> 0x20),(int)in_stack_fffffffffffffba0
                      ,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                      (int)in_stack_fffffffffffffb98);
  if (*puVar2 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Attempt to write tile (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,") more than once.");
    uVar4 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               in_stack_fffffffffffffb78);
    __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (*(int *)((long)&local_10[2].super_mutex.super___mutex_base._M_mutex + 0x18) == 2) {
    writeTileData(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                  (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),(int)in_stack_fffffffffffffb90,
                  in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                  (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  (int)in_stack_fffffffffffffbb8);
  }
  else {
    TileCoord::TileCoord(&local_1c4,local_14,local_18,local_1c,local_20);
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
         ::find((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                 *)in_stack_fffffffffffffb78,(key_type *)0x1715df);
    local_1d8._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
         ::end((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                *)in_stack_fffffffffffffb78);
    bVar1 = std::operator!=(&local_1d0,&local_1d8);
    if (bVar1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_360);
      poVar3 = std::operator<<(local_350,"Attempt to write tile (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      std::operator<<(poVar3,") more than once.");
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                ((ArgExc *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb78);
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    bVar1 = TileCoord::operator==
                      ((TileCoord *)
                       ((long)&local_10[6].super_mutex.super___mutex_base._M_mutex + 0x10),
                       &local_1c4);
    if (bVar1) {
      writeTileData(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                    (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),(int)in_stack_fffffffffffffb90,
                    in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                    (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                    (int)in_stack_fffffffffffffbb8);
      local_370 = (undefined1  [16])
                  TiledOutputFile::Data::nextTileCoord
                            ((Data *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (TileCoord *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      *(undefined8 *)((long)&local_10[6].super_mutex.super___mutex_base._M_mutex + 0x10) =
           local_370._0_8_;
      local_10[6].super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)local_370._8_8_;
      local_378._M_node =
           (_Base_ptr)
           std::
           map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
           ::find(in_stack_00000008,(key_type *)0x171888);
      while( true ) {
        local_380._M_node =
             (_Base_ptr)
             std::
             map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
             ::end(in_stack_00000008);
        bVar1 = std::operator!=(&local_378,&local_380);
        if (!bVar1) break;
        ofd_00 = local_8;
        streamData_00 = local_10;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x1718f1);
        iVar10 = (ppVar5->first).dx;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x171904);
        iVar11 = (ppVar5->first).dy;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x171918);
        iVar12 = (ppVar5->first).lx;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x17192c);
        iVar13 = (ppVar5->first).ly;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x171940);
        in_stack_00000008 =
             (map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
              *)ppVar5->second->pixelData;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x171959);
        iVar9 = ppVar5->second->pixelDataSize;
        writeTileData(streamData_00,ofd_00,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                      (int)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                      in_stack_fffffffffffffb88,(char *)CONCAT44(iVar13,iVar12),
                      (int)in_stack_00000008);
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                               *)0x17199b);
        pBVar6 = ppVar5->second;
        if (pBVar6 != (BufferedTile *)0x0) {
          BufferedTile::~BufferedTile((BufferedTile *)CONCAT44(in_stack_fffffffffffffb84,iVar9));
          operator_delete(pBVar6,0x10);
        }
        __position._M_node._4_4_ = in_stack_fffffffffffffb8c;
        __position._M_node._0_4_ = in_stack_fffffffffffffb88;
        std::
        map<Imf_3_3::(anonymous_namespace)::TileCoord,Imf_3_3::(anonymous_namespace)::BufferedTile*,std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,std::allocator<std::pair<Imf_3_3::(anonymous_namespace)::TileCoord_const,Imf_3_3::(anonymous_namespace)::BufferedTile*>>>
        ::erase_abi_cxx11_((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb84,iVar9),__position);
        TVar8 = TiledOutputFile::Data::nextTileCoord
                          ((Data *)CONCAT44(iVar13,iVar12),(TileCoord *)CONCAT44(iVar11,iVar10));
        local_3a0 = TVar8._0_8_;
        *(undefined8 *)((long)&local_10[6].super_mutex.super___mutex_base._M_mutex + 0x10) =
             local_3a0;
        local_398 = TVar8._8_8_;
        local_10[6].super_mutex.super___mutex_base._M_mutex.__data.__list.__prev = local_398;
        local_378._M_node =
             (_Base_ptr)
             std::
             map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
             ::find(in_stack_00000008,(key_type *)0x171a6c);
      }
    }
    else {
      pBVar6 = (BufferedTile *)operator_new(0x10);
      BufferedTile::BufferedTile
                (pBVar6,(char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb84);
      ppBVar7 = std::
                map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
                ::operator[](in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      *ppBVar7 = pBVar6;
    }
  }
  return;
}

Assistant:

void
bufferedTileWrite (
    OutputStreamMutex*     streamData,
    TiledOutputFile::Data* ofd,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly,
    const char             pixelData[],
    int                    pixelDataSize)
{
    //
    // Check if a tile with coordinates (dx,dy,lx,ly) has already been written.
    //

    if (ofd->tileOffsets (dx, dy, lx, ly))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Attempt to write tile "
            "(" << dx
                << ", " << dy << ", " << lx << ", " << ly
                << ") "
                   "more than once.");
    }

    //
    // If tiles can be written in random order, then don't buffer anything.
    //

    if (ofd->lineOrder == RANDOM_Y)
    {
        writeTileData (
            streamData, ofd, dx, dy, lx, ly, pixelData, pixelDataSize);
        return;
    }

    //
    // If the tiles cannot be written in random order, then check if a
    // tile with coordinates (dx,dy,lx,ly) has already been buffered.
    //

    TileCoord currentTile = TileCoord (dx, dy, lx, ly);

    if (ofd->tileMap.find (currentTile) != ofd->tileMap.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Attempt to write tile "
            "(" << dx
                << ", " << dy << ", " << lx << ", " << ly
                << ") "
                   "more than once.");
    }

    //
    // If all the tiles before this one have already been written to the file,
    // then write this tile immediately and check if we have buffered tiles
    // that can be written after this tile.
    //
    // Otherwise, buffer the tile so it can be written to file later.
    //

    if (ofd->nextTileToWrite == currentTile)
    {
        writeTileData (
            streamData, ofd, dx, dy, lx, ly, pixelData, pixelDataSize);
        ofd->nextTileToWrite = ofd->nextTileCoord (ofd->nextTileToWrite);

        TileMap::iterator i = ofd->tileMap.find (ofd->nextTileToWrite);

        //
        // Step through the tiles and write all successive buffered tiles after
        // the current one.
        //

        while (i != ofd->tileMap.end ())
        {
            //
            // Write the tile, and then delete the tile's buffered data
            //

            writeTileData (
                streamData,
                ofd,
                i->first.dx,
                i->first.dy,
                i->first.lx,
                i->first.ly,
                i->second->pixelData,
                i->second->pixelDataSize);

            delete i->second;
            ofd->tileMap.erase (i);

            //
            // Proceed to the next tile
            //

            ofd->nextTileToWrite = ofd->nextTileCoord (ofd->nextTileToWrite);
            i                    = ofd->tileMap.find (ofd->nextTileToWrite);
        }
    }
    else
    {
        //
        // Create a new BufferedTile, copy the pixelData into it, and
        // insert it into the tileMap.
        //

        ofd->tileMap[currentTile] =
            new BufferedTile ((const char*) pixelData, pixelDataSize);
    }
}